

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O1

natwm_error workspace_list_send_to_workspace(natwm_state *state,client *client,size_t index)

{
  workspace_list *list;
  natwm_error nVar1;
  workspace *workspace;
  monitor *monitor;
  char *pcVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  workspace *workspace_00;
  
  list = state->workspace_list;
  if (index < list->count) {
    workspace_00 = list->workspaces[index];
  }
  else {
    workspace_00 = (workspace *)0x0;
  }
  if (workspace_00 == (workspace *)0x0) {
    internal_logger(natwm_logger,LEVEL_WARNING,
                    "Attempting to move window to non-existent workspace %u",index,in_R8,in_R9,
                    0x109bc9);
    return INVALID_INPUT_ERROR;
  }
  if (workspace_00->is_focused != false) {
    return NO_ERROR;
  }
  workspace = workspace_list_find_window_workspace(list,client->window);
  if (workspace == (workspace *)0x0) {
    pcVar2 = "Failed to find current workspace when moving client to new workspace";
LAB_00109cb2:
    internal_logger(natwm_logger,LEVEL_ERROR,pcVar2);
    nVar1 = RESOLUTION_FAILURE;
  }
  else {
    client_hide(state,client);
    nVar1 = workspace_remove_client(state,workspace,client);
    if (nVar1 == NO_ERROR) {
      nVar1 = workspace_add_client(state,workspace_00,client);
      if (nVar1 == NO_ERROR) {
        if (workspace_00->is_visible != true) {
          return NO_ERROR;
        }
        monitor = monitor_list_get_workspace_monitor(state->monitor_list,workspace_00);
        if (monitor != (monitor *)0x0) {
          client_show(state,monitor,client);
          return NO_ERROR;
        }
        pcVar2 = "Failed to find workspace monitor when sending client to workspace";
        goto LAB_00109cb2;
      }
      pcVar2 = "Failed to add client to workspace";
    }
    else {
      pcVar2 = "Failed to remove client from current workspace while moving client to new workspace"
      ;
    }
    internal_logger(natwm_logger,LEVEL_ERROR,pcVar2);
  }
  return nVar1;
}

Assistant:

enum natwm_error workspace_list_send_to_workspace(struct natwm_state *state, struct client *client,
                                                  size_t index)
{
        struct workspace *next_workspace
                = workspace_list_get_workspace(state->workspace_list, index);

        if (!next_workspace) {
                LOG_WARNING(natwm_logger,
                            "Attempting to move window to non-existent "
                            "workspace %u",
                            index);

                return INVALID_INPUT_ERROR;
        }

        if (next_workspace->is_focused) {
                return NO_ERROR;
        }

        struct workspace *client_workspace
                = workspace_list_find_client_workspace(state->workspace_list, client);

        if (!client_workspace) {
                LOG_ERROR(natwm_logger,
                          "Failed to find current workspace when moving "
                          "client to new workspace");

                return RESOLUTION_FAILURE;
        }

        enum natwm_error err = GENERIC_ERROR;

        client_hide(state, client);

        err = workspace_remove_client(state, client_workspace, client);

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger,
                          "Failed to remove client from current workspace "
                          "while moving client to new workspace");

                return err;
        }

        err = workspace_add_client(state, next_workspace, client);

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger, "Failed to add client to workspace");

                return err;
        }

        // If the next workspace is not on a visible monitor we are done
        if (!next_workspace->is_visible) {
                return NO_ERROR;
        }

        // Otherwise we need to map the client on the next monitor
        struct monitor *next_monitor
                = monitor_list_get_workspace_monitor(state->monitor_list, next_workspace);

        if (!next_monitor) {
                LOG_ERROR(natwm_logger,
                          "Failed to find workspace monitor when sending "
                          "client to workspace");

                return RESOLUTION_FAILURE;
        }

        client_show(state, next_monitor, client);

        return NO_ERROR;
}